

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

int TestRegXmmEncoding(CodeGenGenericContext *ctx,uchar *stream,x86Command op,
                      _func_int_uchar_ptr_x86Reg_x86XmmReg *fun)

{
  x86Reg reg1;
  x86XmmReg reg2;
  int iVar1;
  long lVar2;
  uchar *puVar3;
  long lVar4;
  int local_48;
  
  puVar3 = stream;
  for (lVar2 = 0; lVar2 != 9; lVar2 = lVar2 + 1) {
    reg1 = testRegs[lVar2];
    for (lVar4 = 0; lVar4 != 0x18; lVar4 = lVar4 + 4) {
      reg2 = *(x86XmmReg *)((long)testXmmRegs + lVar4);
      EMIT_OP_REG_REG(ctx,op,reg1,reg2);
      iVar1 = (*fun)(puVar3,reg1,reg2);
      puVar3 = puVar3 + iVar1;
    }
  }
  local_48 = (int)stream;
  return (int)puVar3 - local_48;
}

Assistant:

int TestRegXmmEncoding(CodeGenGenericContext &ctx, unsigned char *stream, x86Command op, int (*fun)(unsigned char *stream, x86Reg dst, x86XmmReg src))
{
	unsigned char *start = stream;

	for(unsigned reg = 0; reg < sizeof(testRegs) / sizeof(testRegs[0]); reg++)
	{
		for(unsigned xmm = 0; xmm < sizeof(testXmmRegs) / sizeof(testXmmRegs[0]); xmm++)
		{
			EMIT_OP_REG_REG(ctx, op, testRegs[reg], testXmmRegs[xmm]);
			stream += fun(stream, testRegs[reg], testXmmRegs[xmm]);
		}
	}

	return int(stream - start);
}